

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O1

void __thiscall chatra::RuntimeImp::checkGc(RuntimeImp *this)

{
  atomic<int> *paVar1;
  bool bVar2;
  int iVar3;
  
  LOCK();
  paVar1 = &this->gcWaitCount;
  iVar3 = (paVar1->super___atomic_base<int>)._M_i;
  (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + -1;
  UNLOCK();
  if (iVar3 == 0) {
    iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->mtGc);
    if (iVar3 != 0) {
      std::__throw_system_error(iVar3);
    }
    bVar2 = Storage::tidy((this->storage).
                          super___shared_ptr<chatra::Storage,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                          &this->super_IConcurrentGcConfiguration);
    if (bVar2) {
      Storage::collect((this->storage).
                       super___shared_ptr<chatra::Storage,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                       (((this->gcThread)._M_t.
                         super___uniq_ptr_impl<chatra::Thread,_std::default_delete<chatra::Thread>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_chatra::Thread_*,_std::default_delete<chatra::Thread>_>
                         .super__Head_base<0UL,_chatra::Thread_*,_false>._M_head_impl)->
                       super_IdType<chatra::Requester,_chatra::Thread>).id);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->mtGc);
    iVar3 = 100;
    if (this->multiThread != false) {
      iVar3 = (this->targetWorkerThreads + (uint)(this->targetWorkerThreads == 0)) * 100;
    }
    LOCK();
    (this->gcWaitCount).super___atomic_base<int>._M_i = iVar3;
    UNLOCK();
  }
  return;
}

Assistant:

void RuntimeImp::checkGc() {
	if (gcWaitCount-- != 0)
		return;

	{
		std::lock_guard<std::mutex> lock(mtGc);
		if (storage->tidy(*this))
			storage->collect(gcThread->getId());
	}

	gcWaitCount = 100 * (multiThread ? std::max(1U, targetWorkerThreads) : 1);
}